

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ElectricityBill.h
# Opt level: O2

void __thiscall RoomInfo::RoomInfo(RoomInfo *this,string *flat,string *room)

{
  std::__cxx11::string::string((string *)this,(string *)flat);
  std::__cxx11::string::string((string *)&this->roomname,(string *)room);
  return;
}

Assistant:

RoomInfo(const std::string& flat, const std::string& room):
			flatname(flat),
			roomname(room)
	{

	}